

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O2

void __thiscall MotionBase::MotionBase(MotionBase *this,MotionBase *prevMotion)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  this->_vptr_MotionBase = (_func_int **)&PTR__MotionBase_00121490;
  this->accel = 0.0;
  if (prevMotion == (MotionBase *)0x0) {
    dVar1 = 0.0;
    dVar2 = 0.0;
    dVar3 = 0.0;
  }
  else {
    dVar1 = prevMotion->tf;
    dVar2 = prevMotion->pf;
    dVar3 = prevMotion->vf;
  }
  this->t0 = dVar1;
  this->p0 = dVar2;
  this->v0 = dVar3;
  this->tf = dVar1;
  this->pf = dVar2;
  this->vf = dVar3;
  return;
}

Assistant:

MotionBase::MotionBase(const MotionBase *prevMotion) : accel(0.0)
{
    if (prevMotion) {
        t0 = prevMotion->tf;
        p0 = prevMotion->pf;
        v0 = prevMotion->vf;
    }
    else {
        t0 = 0.0;
        p0 = 0.0;
        v0 = 0.0;
    }
    // Derived classes should override these default values.
    // Note that (tf == t0) is used to indicate an error.
    tf = t0;
    pf = p0;
    vf = v0;
}